

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_protocol.cc
# Opt level: O0

session * __thiscall helix::nasdaq::itch50_protocol::new_session(itch50_protocol *this,void *data)

{
  bool bVar1;
  session *data_00;
  invalid_argument *this_00;
  binaryfile_session<helix::nasdaq::itch50_handler> *in_RDI;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (!bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::invalid_argument::invalid_argument(this_00,local_40);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  data_00 = (session *)operator_new(0xd0);
  binaryfile_session<helix::nasdaq::itch50_handler>::binaryfile_session(in_RDI,data_00);
  return data_00;
}

Assistant:

session* itch50_protocol::new_session(void *data)
{
    if (_name == "nasdaq-binaryfile-itch50") {
        return new binaryfile_session<itch50_handler>(data);
    } else {
        throw std::invalid_argument("unknown protocol: " + _name);
    }
}